

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O1

bool __thiscall
MeCab::FeatureIndex::buildUnigramFeature(FeatureIndex *this,LearnerPath *path,char *ufeature)

{
  StringBuffer *this_00;
  byte bVar1;
  pointer piVar2;
  mecab_learner_node_t *pmVar3;
  iterator iVar4;
  _func_int ***ppp_Var5;
  char cVar6;
  size_t sVar7;
  FeatureIndex *pFVar8;
  ostream *poVar9;
  char *pcVar10;
  int *__dest;
  char *pcVar11;
  size_t __n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *__buf;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *__buf_00;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  void *extraout_RDX_07;
  void *extraout_RDX_08;
  FeatureIndex *pFVar12;
  FeatureIndex *pFVar13;
  FeatureIndex *this_01;
  ulong uVar14;
  char **ppcVar15;
  pointer ppcVar16;
  FeatureIndex *pFVar17;
  char *p;
  int id;
  char *local_78;
  int local_6c;
  FeatureIndex *local_68;
  char **local_60;
  FeatureIndex *local_58;
  size_t local_50;
  LearnerPath *local_48;
  FeatureIndex *local_40;
  char *local_38;
  
  local_48 = path;
  local_38 = ufeature;
  local_58 = (FeatureIndex *)operator_new__(0x800);
  local_60 = (char **)operator_new__(0x200);
  pFVar17 = local_58;
  piVar2 = (this->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish != piVar2) {
    (this->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  local_68 = this;
  strncpy((char *)local_58,local_38,0x800);
  this_01 = pFVar17;
  sVar7 = strlen((char *)pFVar17);
  if ((long)sVar7 < 1) {
    local_50 = 0;
    __buf = extraout_RDX;
  }
  else {
    pFVar12 = (FeatureIndex *)((long)&pFVar17->_vptr_FeatureIndex + sVar7);
    uVar14 = 0x40;
    local_50 = 0;
    ppcVar15 = local_60;
    do {
      for (; (cVar6 = *(char *)&pFVar17->_vptr_FeatureIndex, cVar6 == '\t' || (cVar6 == ' '));
          pFVar17 = (FeatureIndex *)((long)&pFVar17->_vptr_FeatureIndex + 1)) {
      }
      if (cVar6 == '\"') {
        pFVar17 = (FeatureIndex *)((long)&pFVar17->_vptr_FeatureIndex + 1);
        pFVar13 = pFVar17;
        for (pFVar8 = pFVar17;
            (this_01 = pFVar8, pFVar8 < pFVar12 &&
            ((*(char *)&pFVar8->_vptr_FeatureIndex != '\"' ||
             (this_01 = (FeatureIndex *)((long)&pFVar8->_vptr_FeatureIndex + 1),
             ppp_Var5 = &pFVar8->_vptr_FeatureIndex, pFVar8 = this_01,
             *(char *)((long)ppp_Var5 + 1) == '\"'))));
            pFVar8 = (FeatureIndex *)((long)&pFVar8->_vptr_FeatureIndex + 1)) {
          *(undefined1 *)&pFVar13->_vptr_FeatureIndex = *(undefined1 *)&pFVar8->_vptr_FeatureIndex;
          pFVar13 = (FeatureIndex *)((long)&pFVar13->_vptr_FeatureIndex + 1);
        }
        local_78 = (char *)CONCAT71(local_78._1_7_,0x2c);
        pFVar8 = (FeatureIndex *)
                 std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                           (this_01,pFVar12,&stack0xffffffffffffff88);
        __buf = extraout_RDX_00;
      }
      else {
        local_78 = (char *)CONCAT71(local_78._1_7_,0x2c);
        this_01 = pFVar17;
        pFVar8 = (FeatureIndex *)
                 std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                           (pFVar17,pFVar12,&stack0xffffffffffffff88);
        __buf = extraout_RDX_01;
        pFVar13 = pFVar8;
      }
      if (1 < uVar14) {
        *(undefined1 *)&pFVar13->_vptr_FeatureIndex = 0;
      }
      uVar14 = uVar14 - 1;
      *ppcVar15 = (char *)pFVar17;
      local_50 = local_50 + 1;
      if (uVar14 == 0) break;
      ppcVar15 = ppcVar15 + 1;
      pFVar17 = (FeatureIndex *)((long)&pFVar8->_vptr_FeatureIndex + 1);
    } while (pFVar17 < pFVar12);
  }
  local_40 = (FeatureIndex *)&local_68->feature_;
  ppcVar16 = (local_68->unigram_templs_).
             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppcVar16 !=
      (local_68->unigram_templs_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    this_00 = &local_68->os_;
    do {
      local_78 = *ppcVar16;
      (local_68->os_).size_ = 0;
LAB_0013fefa:
      pcVar10 = local_78;
      cVar6 = *local_78;
      if (cVar6 == '%') {
        pcVar11 = local_78 + 1;
        bVar1 = local_78[1];
        local_78 = pcVar11;
        if (bVar1 < 0x75) {
          if (bVar1 == 0x46) {
            __n = local_50;
            pcVar10 = getIndex(this_01,&stack0xffffffffffffff88,local_60,local_50);
            __buf = __buf_00;
            if ((pcVar10 == (char *)0x0) ||
               (this_01 = (FeatureIndex *)this_00,
               StringBuffer::write(this_00,(int)pcVar10,__buf_00,__n), __buf = extraout_RDX_05,
               pcVar10 == (char *)0x0)) goto LAB_00140164;
          }
          else {
            if (bVar1 != 0x74) goto LAB_0013ffb9;
            this_01 = (FeatureIndex *)this_00;
            StringBuffer::operator<<(this_00,(ulong)local_48->rnode->char_type);
            __buf = extraout_RDX_03;
          }
        }
        else if (bVar1 == 0x75) {
          this_01 = (FeatureIndex *)this_00;
          StringBuffer::write(this_00,(int)local_38,__buf,(size_t)pcVar10);
          __buf = extraout_RDX_06;
        }
        else {
          if ((bVar1 == 0x77) && (pmVar3 = local_48->rnode, pmVar3->stat == '\0')) {
            StringBuffer::write(this_00,(int)pmVar3->surface,(void *)(ulong)pmVar3->length,
                                (size_t)pcVar10);
          }
LAB_0013ffb9:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                     ,0x73);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x16b);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,") [",3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"false",5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] ",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"unknown meta char: ",0x13);
          local_6c = CONCAT31(local_6c._1_3_,*pcVar11);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,(char *)&stack0xffffffffffffff94,1);
          this_01 = (FeatureIndex *)&stack0xffffffffffffff87;
          die::~die((die *)this_01);
          __buf = extraout_RDX_04;
        }
        goto LAB_0013ff1f;
      }
      if (cVar6 == '\\') {
        pcVar10 = local_78 + 1;
        bVar1 = local_78[1];
        pcVar11 = (char *)(ulong)bVar1;
        cVar6 = '\0';
        local_78 = pcVar10;
        if (bVar1 < 0x66) {
          if (bVar1 == 0x5c) {
            cVar6 = '\\';
          }
          else if (bVar1 == 0x61) {
            cVar6 = '\a';
          }
          else if (bVar1 == 0x62) {
            cVar6 = '\b';
          }
        }
        else {
          __buf = (void *)(ulong)(bVar1 - 0x6e);
          if (bVar1 - 0x6e < 9) {
            pcVar11 = (char *)((long)&switchD_0013ff51::switchdataD_0015c88c +
                              (long)(int)(&switchD_0013ff51::switchdataD_0015c88c)[(long)__buf]);
            switch(__buf) {
            case (void *)0x0:
              cVar6 = '\n';
              break;
            case (void *)0x4:
              cVar6 = '\r';
              break;
            case (void *)0x5:
              cVar6 = ' ';
              break;
            case (void *)0x6:
              cVar6 = '\t';
              break;
            case (void *)0x8:
              cVar6 = '\v';
            }
          }
          else if (bVar1 == 0x66) {
            cVar6 = '\f';
          }
        }
switchD_0013ff51_caseD_6f:
        this_01 = (FeatureIndex *)this_00;
        StringBuffer::write(this_00,(int)cVar6,__buf,(size_t)pcVar11);
        __buf = extraout_RDX_02;
LAB_0013ff1f:
        local_78 = local_78 + 1;
        goto LAB_0013fefa;
      }
      pcVar11 = local_78;
      if (cVar6 != '\0') goto switchD_0013ff51_caseD_6f;
      StringBuffer::write(this_00,0,__buf,(size_t)local_78);
      this_01 = local_68;
      local_6c = (*local_68->_vptr_FeatureIndex[6])();
      __buf = extraout_RDX_07;
      if (local_6c != -1) {
        iVar4._M_current =
             (local_68->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (local_68->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          this_01 = local_40;
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)local_40,iVar4,&stack0xffffffffffffff94);
          __buf = extraout_RDX_08;
        }
        else {
          *iVar4._M_current = local_6c;
          (local_68->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
      }
LAB_00140164:
      ppcVar16 = ppcVar16 + 1;
    } while (ppcVar16 !=
             (local_68->unigram_templs_).
             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  pFVar17 = local_68;
  local_78 = (char *)CONCAT44(local_78._4_4_,0xffffffff);
  iVar4._M_current =
       (local_68->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (local_68->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              ((vector<int,_std::allocator<int>_> *)local_40,iVar4,(int *)&stack0xffffffffffffff88);
  }
  else {
    *iVar4._M_current = -1;
    (local_68->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current + 1;
  }
  __dest = ChunkFreeList<int>::alloc
                     (&pFVar17->feature_freelist_,
                      (long)(pFVar17->feature_).super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(pFVar17->feature_).super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 2);
  local_48->rnode->fvector = __dest;
  piVar2 = (pFVar17->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar7 = (long)(pFVar17->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar2;
  if (sVar7 != 0) {
    memmove(__dest,piVar2,sVar7);
  }
  piVar2 = (pFVar17->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((pFVar17->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar2) {
    (pFVar17->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar2;
  }
  operator_delete__(local_60);
  operator_delete__(local_58);
  return true;
}

Assistant:

bool FeatureIndex::buildUnigramFeature(LearnerPath *path,
                                       const char *ufeature) {
  scoped_fixed_array<char, BUFSIZE> ubuf;
  scoped_fixed_array<char *, POSSIZE> F;

  feature_.clear();
  std::strncpy(ubuf.get(), ufeature, ubuf.size());
  const size_t usize = tokenizeCSV(ubuf.get(), F.get(), F.size());

  for (std::vector<const char*>::const_iterator it = unigram_templs_.begin();
       it != unigram_templs_.end(); ++it) {
    const char *p = *it;
    os_.clear();

    for (; *p; p++) {
      switch (*p) {
        default: os_ << *p; break;
        case '\\': os_ << getEscapedChar(*++p); break;
        case '%': {
          switch (*++p) {
            case 'F':  {
              const char *r = getIndex(const_cast<char **>(&p), F.get(), usize);
              if (!r) goto NEXT;
              os_ << r;
            } break;
            case 't':  os_ << (size_t)path->rnode->char_type;     break;
            case 'u':  os_ << ufeature; break;
            case 'w':
              if (path->rnode->stat == MECAB_NOR_NODE) {
                os_.write(path->rnode->surface, path->rnode->length);
              }
            default:
              CHECK_DIE(false) << "unknown meta char: " <<  *p;
          }
        }
      }
    }

    os_ << '\0';
    ADDB(os_.str());

 NEXT: continue;
  }

  COPY_FEATURE(path->rnode->fvector);

  return true;
}